

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::Array2D<pbrt::RGBFilm::Pixel>::Array2D
          (Array2D<pbrt::RGBFilm::Pixel> *this,Bounds2i *extent,allocator_type allocator)

{
  int iVar1;
  Pixel *pPVar2;
  double in_RDX;
  double *in_RSI;
  Pixel *in_RDI;
  int i;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  
  in_RDI->rgbSum[0] = *in_RSI;
  in_RDI->rgbSum[1] = in_RSI[1];
  in_RDI->rgbSum[2] = in_RDX;
  iVar1 = Bounds2<int>::Area((Bounds2<int> *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  pPVar2 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::RGBFilm::Pixel>
                     ((polymorphic_allocator<std::byte> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                      (size_t)in_RDI);
  in_RDI->weightSum = (double)pPVar2;
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pstd::pmr::polymorphic_allocator<std::byte>::construct<pbrt::RGBFilm::Pixel>
              ((polymorphic_allocator<std::byte> *)CONCAT44(iVar1,iVar3),in_RDI);
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, allocator_type allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }